

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::initial_kmer_lcp(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                   *this,uint k,uint bits_per_char,
                  vector<unsigned_long,_std::allocator<unsigned_long>_> *param_3)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  unsigned_long uVar1;
  pointer puVar2;
  unsigned_long y;
  uint uVar3;
  size_t i;
  ulong uVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  pair<unsigned_long,_unsigned_long> right_B;
  
  this_00 = &this->local_LCP;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_fill_assign
            (this_00,this->local_size,&this->n);
  right_B.first =
       (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  right_B.second =
       (param_3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish[-1];
  pVar5 = mxx::right_shift<std::pair<unsigned_long,unsigned_long>>(&right_B,&this->comm);
  if ((this->comm).m_rank == 0) {
    uVar4 = 0;
  }
  else {
    uVar1 = *(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pVar5.first == uVar1) &&
       (pVar5.second ==
        *(param_3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start)) goto LAB_00130ef4;
    uVar3 = lcp_bitwise<unsigned_long>(pVar5.first,uVar1,k,bits_per_char);
    if (uVar3 == k) {
      uVar3 = lcp_bitwise<unsigned_long>
                        (pVar5.second,
                         *(param_3->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start,k,bits_per_char);
      uVar3 = uVar3 + k;
    }
    uVar4 = (ulong)uVar3;
  }
  *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start = uVar4;
LAB_00130ef4:
  for (uVar4 = 1; uVar4 < this->local_size; uVar4 = uVar4 + 1) {
    puVar2 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = puVar2[uVar4 - 1];
    y = puVar2[uVar4];
    if ((uVar1 != y) ||
       (puVar2 = (param_3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start, puVar2[uVar4 - 1] != puVar2[uVar4])) {
      uVar3 = lcp_bitwise<unsigned_long>(uVar1,y,k,bits_per_char);
      if (uVar3 == k) {
        puVar2 = (param_3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = lcp_bitwise<unsigned_long>(puVar2[uVar4 - 1],puVar2[uVar4],k,bits_per_char);
        uVar3 = uVar3 + k;
      }
      (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4] = (ulong)uVar3;
    }
  }
  return;
}

Assistant:

void initial_kmer_lcp(unsigned int k, unsigned int bits_per_char,
                      const std::vector<index_t>& local_B2) {
    // for each bucket boundary (using both the B1 and the B2 buckets):
    //    get the LCP by getting position of first different bit and dividing by
    //    `bits_per_char`

    // resize to size `local_size` and set all items to max of n
    local_LCP.assign(local_size, n);

    // find bucket boundaries (including across processors)

    // 1) getting next element to left
    std::pair<index_t, index_t> right_B(local_B.back(), local_B2.back());
    std::pair<index_t, index_t> left_B = mxx::right_shift(right_B, comm);

    // initialize first LCP
    if (comm.rank() == 0) {
        local_LCP[0] = 0;
    } else {
        if (left_B.first != local_B[0]
            || (left_B.first == local_B[0] && left_B.second != local_B2[0])) {
            unsigned int lcp = lcp_bitwise(left_B.first, local_B[0], k, bits_per_char);
            if (lcp == k)
                lcp += lcp_bitwise(left_B.second, local_B2[0], k, bits_per_char);
            local_LCP[0] = lcp;
        }
    }

    // intialize the LCP for all other elements for bucket boundaries
    for (std::size_t i = 1; i < local_size; ++i)
    {
        if (local_B[i-1] != local_B[i]
            || (local_B[i-1] == local_B[i] && local_B2[i-1] != local_B2[i])) {
            unsigned int lcp = lcp_bitwise(local_B[i-1], local_B[i], k, bits_per_char);
            if (lcp == k)
                lcp += lcp_bitwise(local_B2[i-1], local_B2[i], k, bits_per_char);
            local_LCP[i] = lcp;
        }
    }
}